

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

bool peparse::readCString(bounded_buffer *buffer,uint32_t off,string *result)

{
  uint8_t *this;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  const_iterator local_58;
  int local_4c;
  uchar *local_48;
  uint8_t *x;
  uint8_t *b;
  uint8_t *puStack_30;
  uint32_t n;
  uint8_t *p;
  string *result_local;
  bounded_buffer *pbStack_18;
  uint32_t off_local;
  bounded_buffer *buffer_local;
  
  if (off < buffer->bufLen) {
    puStack_30 = buffer->buf;
    b._4_4_ = buffer->bufLen;
    x = puStack_30 + off;
    local_4c = 0;
    p = (uint8_t *)result;
    result_local._4_4_ = off;
    pbStack_18 = buffer;
    local_48 = std::find<unsigned_char*,int>(x,puStack_30 + b._4_4_,&local_4c);
    this = p;
    if (local_48 == puStack_30 + b._4_4_) {
      buffer_local._7_1_ = false;
    }
    else {
      local_60._M_current = (char *)std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_58,&local_60);
      std::__cxx11::string::insert<unsigned_char*,void>((string *)this,local_58,x,local_48);
      buffer_local._7_1_ = true;
    }
  }
  else {
    buffer_local._7_1_ = false;
  }
  return buffer_local._7_1_;
}

Assistant:

static bool
readCString(const bounded_buffer &buffer, std::uint32_t off, string &result) {
  if (off < buffer.bufLen) {
    std::uint8_t *p = buffer.buf;
    std::uint32_t n = buffer.bufLen;
    std::uint8_t *b = p + off;
    std::uint8_t *x = std::find(b, p + n, 0);

    if (x == p + n) {
      return false;
    }

    result.insert(result.end(), b, x);
    return true;
  }
  return false;
}